

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O2

void __thiscall
Firework::Firework(Firework *this,char ball,char stream,char tail,char explosionParticle)

{
  (this->ball)._M_dataplus._M_p = (pointer)&(this->ball).field_2;
  (this->ball)._M_string_length = 0;
  (this->ball).field_2._M_local_buf[0] = '\0';
  (this->stream)._M_dataplus._M_p = (pointer)&(this->stream).field_2;
  (this->stream)._M_string_length = 0;
  (this->stream).field_2._M_local_buf[0] = '\0';
  (this->tail)._M_dataplus._M_p = (pointer)&(this->tail).field_2;
  (this->tail)._M_string_length = 0;
  (this->tail).field_2._M_local_buf[0] = '\0';
  (this->explosionParticle)._M_dataplus._M_p = (pointer)&(this->explosionParticle).field_2;
  (this->explosionParticle)._M_string_length = 0;
  (this->explosionParticle).field_2._M_local_buf[0] = '\0';
  this->fireworkStage = 0;
  std::__cxx11::string::operator=((string *)this,ball);
  std::__cxx11::string::operator=((string *)&this->stream,stream);
  std::__cxx11::string::operator=((string *)&this->tail,tail);
  std::__cxx11::string::operator=((string *)&this->explosionParticle,explosionParticle);
  this->streamFrameCounter = 1;
  this->explosionFrameCounter = 0.0;
  return;
}

Assistant:

Firework::Firework(char ball, char stream, char tail, char explosionParticle) {
    fireworkStage = UNITIALIZED;

    this->ball = ball;
    this->stream = stream;
    this->tail = tail;
    this->explosionParticle = explosionParticle;

    streamFrameCounter = 1;
    explosionFrameCounter = 0;
}